

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O0

int slu_mmdint_(int *neqns,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_44;
  int fnode;
  int node;
  int ndeg;
  int i__1;
  int *dbakw_local;
  int *dforw_local;
  shortint *dhead_local;
  shortint *adjncy_local;
  int_t *xadj_local;
  int *neqns_local;
  
  iVar1 = *neqns;
  for (local_44 = 1; local_44 <= iVar1; local_44 = local_44 + 1) {
    dhead[(long)local_44 + -1] = 0;
    qsize[(long)local_44 + -1] = 1;
    marker[(long)local_44 + -1] = 0;
    llist[(long)local_44 + -1] = 0;
  }
  iVar1 = *neqns;
  for (local_44 = 1; local_44 <= iVar1; local_44 = local_44 + 1) {
    iVar3 = (xadj[(long)(local_44 + 1) + -1] - xadj[(long)local_44 + -1]) + 1;
    iVar2 = dhead[(long)iVar3 + -1];
    dforw[(long)local_44 + -1] = iVar2;
    dhead[(long)iVar3 + -1] = local_44;
    if (0 < iVar2) {
      dbakw[(long)iVar2 + -1] = local_44;
    }
    dbakw[(long)local_44 + -1] = -iVar3;
  }
  return 0;
}

Assistant:

int slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
	shortint *dhead, int *dforw, int *dbakw, shortint *qsize, 
	shortint *llist, shortint *marker)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int ndeg, node, fnode;

/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	dhead[node] = 0;
	qsize[node] = 1;
	marker[node] = 0;
	llist[node] = 0;
/* L100: */
    }
/*        ------------------------------------------ */
/*        INITIALIZE THE DEGREE DOUBLY LINKED LISTS. */
/*        ------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	ndeg = xadj[node + 1] - xadj[node] + 1;
	fnode = dhead[ndeg];
	dforw[node] = fnode;
	dhead[ndeg] = node;
	if (fnode > 0) {
	    dbakw[fnode] = node;
	}
	dbakw[node] = -ndeg;
/* L200: */
    }
    return 0;

}